

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O1

TypeBase * anon_unknown.dwarf_11255e::LookupTypeByName(ExpressionContext *ctx,uint nameHash)

{
  SynBase *pSVar1;
  TypeBase *pTVar2;
  bool bVar3;
  TypeBase *in_RAX;
  ScopeData *pSVar4;
  long lVar5;
  Node *pNVar6;
  Node *pNVar7;
  TypeBase *pTVar8;
  char cVar9;
  
  pSVar4 = ctx->scope;
  if (pSVar4 == (ScopeData *)0x0) {
    return (TypeBase *)0x0;
  }
  pSVar1 = ctx->lookupLocation;
  do {
    pNVar7 = (pSVar4->typeLookupMap).data;
    lVar5 = (ulong)((pSVar4->typeLookupMap).bucketCount - 1 & nameHash) * 0x20;
    if (*(long *)(pNVar7 + lVar5 + 0x18) != 0) {
      pNVar7 = pNVar7 + lVar5;
      pNVar6 = pNVar7;
      do {
        if (pNVar6 == (Node *)0x0) break;
        if (*(uint *)pNVar6 == nameHash) {
          pNVar6 = pNVar6 + 8;
          goto LAB_001ed940;
        }
        pNVar6 = *(Node **)(pNVar6 + 0x18);
      } while (pNVar6 != pNVar7);
    }
    pNVar6 = (Node *)0x0;
LAB_001ed940:
    if (pNVar6 == (Node *)0x0) {
      cVar9 = '\0';
    }
    else {
      pTVar2 = *(TypeBase **)pNVar6;
      cVar9 = pTVar2 != (TypeBase *)0x0;
      pTVar8 = pTVar2;
      if (!(bool)cVar9) {
        pTVar8 = in_RAX;
      }
      if ((((bool)cVar9 && pSVar1 != (SynBase *)0x0) &&
          (cVar9 = '\x01', pTVar8 = pTVar2, pSVar4->unrestricted == false)) &&
         (pTVar2->importModule == (ModuleData *)0x0)) {
        lVar5 = 0xd8;
        if ((pTVar2->typeID == 0x18) || (lVar5 = 0xc0, pTVar2->typeID == 0x16)) {
          lVar5 = *(long *)((long)&pTVar2->_vptr_TypeBase + lVar5);
        }
        else {
          lVar5 = 0;
        }
        cVar9 = '\0';
        bVar3 = true;
        if ((lVar5 != 0) && ((pSVar1->pos).begin < *(char **)(lVar5 + 0x20))) {
          pSVar4 = pSVar4->scope;
          cVar9 = '\x02';
          bVar3 = false;
        }
        pTVar8 = in_RAX;
        if (bVar3) {
          cVar9 = '\x01';
          pTVar8 = pTVar2;
        }
      }
      in_RAX = pTVar8;
      if (cVar9 == '\0') {
        if ((((pSVar1 == (SynBase *)0x0) || (pSVar4->unrestricted != false)) ||
            ((*(long **)(pNVar6 + 8))[1] != 0)) ||
           (*(char **)(**(long **)(pNVar6 + 8) + 0x20) <= (pSVar1->pos).begin)) {
          in_RAX = *(TypeBase **)(*(long *)(pNVar6 + 8) + 0x18);
          cVar9 = '\x01';
        }
        else {
          pSVar4 = pSVar4->scope;
          cVar9 = '\x02';
        }
      }
    }
    if (cVar9 == '\0') {
      pSVar4 = pSVar4->scope;
    }
    else if (cVar9 != '\x02') {
      return in_RAX;
    }
    if (pSVar4 == (ScopeData *)0x0) {
      return (TypeBase *)0x0;
    }
  } while( true );
}

Assistant:

TypeBase* LookupTypeByName(ExpressionContext &ctx, unsigned nameHash)
	{
		ScopeData *scope = ctx.scope;

		while(scope)
		{
			if(TypeLookupResult *lookup = scope->typeLookupMap.find(nameHash))
			{
				if(TypeBase *type = lookup->type)
				{
					// Check type visibility
					if(ctx.lookupLocation && !scope->unrestricted && !type->importModule)
					{
						SynBase *typeLocation = NULL;

						if(TypeClass *exact = getType<TypeClass>(type))
							typeLocation = exact->source;
						else if(TypeGenericClassProto *exact = getType<TypeGenericClassProto>(type))
							typeLocation = exact->definition;

						if(typeLocation && typeLocation->pos.begin > ctx.lookupLocation->pos.begin)
						{
							scope = scope->scope;
							continue;
						}
					}

					return lookup->type;
				}

				// Check alias visibility
				if(ctx.lookupLocation && !scope->unrestricted && !lookup->alias->importModule)
				{
					if(lookup->alias->source->pos.begin > ctx.lookupLocation->pos.begin)
					{
						scope = scope->scope;
						continue;
					}
				}

				return lookup->alias->type;
			}

			scope = scope->scope;
		}

		return NULL;
	}